

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

void lj_state_growstack(lua_State *L,MSize need)

{
  MSize local_18;
  MSize n;
  MSize need_local;
  lua_State *L_local;
  
  if (0xffe4 < L->stacksize) {
    lj_err_throw(L,5);
  }
  local_18 = L->stacksize + need;
  if (local_18 < 0xffdd) {
    if ((local_18 < L->stacksize << 1) && (local_18 = L->stacksize << 1, 0xffdb < local_18)) {
      local_18 = 0xffdc;
    }
  }
  else {
    local_18 = local_18 + 0x28;
  }
  resizestack(L,local_18);
  if (L->stacksize < 0xffe5) {
    return;
  }
  lj_err_msg(L,LJ_ERR_STKOV);
}

Assistant:

void LJ_FASTCALL lj_state_growstack(lua_State *L, MSize need)
{
  MSize n;
  if (L->stacksize > LJ_STACK_MAXEX)  /* Overflow while handling overflow? */
    lj_err_throw(L, LUA_ERRERR);
  n = L->stacksize + need;
  if (n > LJ_STACK_MAX) {
    n += 2*LUA_MINSTACK;
  } else if (n < 2*L->stacksize) {
    n = 2*L->stacksize;
    if (n >= LJ_STACK_MAX)
      n = LJ_STACK_MAX;
  }
  resizestack(L, n);
  if (L->stacksize > LJ_STACK_MAXEX)
    lj_err_msg(L, LJ_ERR_STKOV);
}